

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O0

StatusOr<bool> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetBool
          (UnparseProto3Type *this,Field f,Msg *msg,size_t idx)

{
  int32_t field_number;
  Field *this_00;
  reference pBVar1;
  undefined8 extraout_RDX;
  StatusOr<bool> SVar2;
  Span<const_google::protobuf::json_internal::UntypedMessage::Bool> local_40;
  bool local_29;
  size_t local_28;
  size_t idx_local;
  Msg *msg_local;
  Field f_local;
  
  local_28 = idx;
  idx_local = (size_t)msg;
  msg_local = (Msg *)f;
  f_local = (Field)this;
  this_00 = ResolverPool::Field::proto(f);
  field_number = Field::number(this_00);
  local_40 = UntypedMessage::Get<google::protobuf::json_internal::UntypedMessage::Bool>
                       (msg,field_number);
  pBVar1 = absl::lts_20240722::Span<const_google::protobuf::json_internal::UntypedMessage::Bool>::
           operator[](&local_40,local_28);
  local_29 = *pBVar1 == kTrue;
  absl::lts_20240722::StatusOr<bool>::StatusOr<bool,_0>((StatusOr<bool> *)this,&local_29);
  SVar2.super_StatusOrData<bool>._8_8_ = extraout_RDX;
  SVar2.super_StatusOrData<bool>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)this;
  return (StatusOr<bool>)SVar2.super_StatusOrData<bool>;
}

Assistant:

static absl::StatusOr<bool> GetBool(Field f, const Msg& msg, size_t idx = 0) {
    return msg.Get<Msg::Bool>(f->proto().number())[idx] == Msg::kTrue;
  }